

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fakeit.hpp
# Opt level: O3

void __thiscall
fakeit::DynamicProxy<IMessageHolder>::stubMethod<5,unsigned_long>
          (DynamicProxy<IMessageHolder> *this,offset_in_IMessageHolder_to_subr vMethod,
          MethodInvocationHandler<unsigned_long> *methodInvocationHandler)

{
  uint uVar1;
  Destructible *in_RCX;
  ulong uVar2;
  VirtualOffsetSelector offsetSelctor;
  undefined **local_28 [2];
  
  local_28[0] = &PTR_offset0_0012c0f8;
  if ((vMethod & 1) != 0) {
    vMethod = *(undefined8 *)
               (*(long *)((long)local_28 + (long)methodInvocationHandler) + -1 + vMethod);
  }
  uVar1 = (*(code *)vMethod)((long *)((long)local_28 + (long)methodInvocationHandler),0);
  uVar2 = (ulong)uVar1;
  *(code **)(*(long *)this->instance + uVar2 * 8) =
       MethodProxyCreator<unsigned_long>::methodProxyX<6>;
  std::__shared_ptr<fakeit::Destructible,_(__gnu_cxx::_Lock_policy)2>::reset<fakeit::Destructible>
            (&(this->_methodMocks).
              super__Vector_base<std::shared_ptr<fakeit::Destructible>,_std::allocator<std::shared_ptr<fakeit::Destructible>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar2].
              super___shared_ptr<fakeit::Destructible,_(__gnu_cxx::_Lock_policy)2>,in_RCX);
  (this->_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[uVar2] = 6;
  return;
}

Assistant:

void stubMethod(R(C::*vMethod)(arglist...), MethodInvocationHandler<R, arglist...> *methodInvocationHandler) {
            auto offset = VTUtils::getOffset(vMethod);
            MethodProxyCreator<R, arglist...> creator;
            bind(creator.template createMethodProxy<id + 1>(offset), methodInvocationHandler);
        }